

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O1

void xmlRelaxNGCheckGroupAttrs(xmlRelaxNGParserCtxtPtr ctxt,xmlRelaxNGDefinePtr_conflict def)

{
  xmlRelaxNGDefinePtr_conflict *def1;
  void *pvVar1;
  int iVar2;
  xmlRelaxNGDefinePtr pxVar3;
  void *pvVar4;
  xmlRelaxNGDefinePtr_conflict *ppxVar5;
  ulong uVar6;
  xmlRelaxNGDefinePtr_conflict *extraout_RDX;
  xmlRelaxNGDefinePtr_conflict *extraout_RDX_00;
  xmlRelaxNGDefinePtr_conflict *extraout_RDX_01;
  xmlRelaxNGDefinePtr_conflict *extraout_RDX_02;
  xmlRelaxNGDefinePtr_conflict *extraout_RDX_03;
  uint uVar7;
  ulong uVar8;
  undefined8 *puVar9;
  ulong uVar10;
  
  if ((((def->type == XML_RELAXNG_GROUP) || (def->type == XML_RELAXNG_ELEMENT)) &&
      ((def->dflags & 0x20) == 0)) && (ctxt->nbErrors == 0)) {
    uVar7 = 0;
    for (pxVar3 = def->attrs; pxVar3 != (xmlRelaxNGDefinePtr)0x0; pxVar3 = pxVar3->next) {
      uVar7 = uVar7 + 1;
    }
    for (pxVar3 = def->content; pxVar3 != (xmlRelaxNGDefinePtr)0x0; pxVar3 = pxVar3->next) {
      uVar7 = uVar7 + 1;
    }
    uVar6 = (ulong)uVar7;
    pvVar4 = (*xmlMalloc)(uVar6 * 8);
    if (pvVar4 == (void *)0x0) {
      xmlRngPErrMemory(ctxt,"building group\n");
      return;
    }
    pxVar3 = def->attrs;
    if (pxVar3 == (xmlRelaxNGDefinePtr)0x0) {
      uVar8 = 0;
      ppxVar5 = extraout_RDX;
    }
    else {
      uVar8 = 0;
      do {
        ppxVar5 = xmlRelaxNGGetElements(ctxt,pxVar3,1);
        *(xmlRelaxNGDefinePtr_conflict **)((long)pvVar4 + uVar8 * 8) = ppxVar5;
        uVar8 = uVar8 + 1;
        pxVar3 = pxVar3->next;
      } while (pxVar3 != (xmlRelaxNGDefinePtr)0x0);
      uVar8 = uVar8 & 0xffffffff;
      ppxVar5 = extraout_RDX_00;
    }
    pxVar3 = def->content;
    if (pxVar3 != (xmlRelaxNGDefinePtr)0x0) {
      puVar9 = (undefined8 *)((long)pvVar4 + uVar8 * 8);
      do {
        ppxVar5 = xmlRelaxNGGetElements(ctxt,pxVar3,1);
        *puVar9 = ppxVar5;
        pxVar3 = pxVar3->next;
        puVar9 = puVar9 + 1;
        ppxVar5 = extraout_RDX_01;
      } while (pxVar3 != (xmlRelaxNGDefinePtr)0x0);
    }
    if (uVar7 != 0) {
      uVar8 = 0;
      do {
        if (uVar8 != 0 && *(long *)((long)pvVar4 + uVar8 * 8) != 0) {
          uVar10 = 0;
          do {
            def1 = *(xmlRelaxNGDefinePtr_conflict **)((long)pvVar4 + uVar10 * 8);
            if (def1 != (xmlRelaxNGDefinePtr_conflict *)0x0) {
              iVar2 = xmlRelaxNGCompareElemDefLists
                                (*(xmlRelaxNGParserCtxtPtr *)((long)pvVar4 + uVar8 * 8),def1,ppxVar5
                                );
              ppxVar5 = extraout_RDX_02;
              if (iVar2 == 0) {
                xmlRngPErr(ctxt,def->node,0x410,"Attributes conflicts in group\n",(xmlChar *)0x0,
                           (xmlChar *)0x0);
                ppxVar5 = extraout_RDX_03;
              }
            }
            uVar10 = uVar10 + 1;
          } while (uVar8 != uVar10);
        }
        uVar8 = uVar8 + 1;
      } while (uVar8 != uVar6);
      uVar8 = 0;
      do {
        pvVar1 = *(void **)((long)pvVar4 + uVar8 * 8);
        if (pvVar1 != (void *)0x0) {
          (*xmlFree)(pvVar1);
        }
        uVar8 = uVar8 + 1;
      } while (uVar6 != uVar8);
    }
    (*xmlFree)(pvVar4);
    *(byte *)&def->dflags = (byte)def->dflags | 0x20;
  }
  return;
}

Assistant:

static void
xmlRelaxNGCheckGroupAttrs(xmlRelaxNGParserCtxtPtr ctxt,
                          xmlRelaxNGDefinePtr def)
{
    xmlRelaxNGDefinePtr **list;
    xmlRelaxNGDefinePtr cur;
    int nbchild = 0, i, j, ret;

    if ((def == NULL) ||
        ((def->type != XML_RELAXNG_GROUP) &&
         (def->type != XML_RELAXNG_ELEMENT)))
        return;

    if (def->dflags & IS_PROCESSED)
        return;

    /*
     * Don't run that check in case of error. Infinite recursion
     * becomes possible.
     */
    if (ctxt->nbErrors != 0)
        return;

    cur = def->attrs;
    while (cur != NULL) {
        nbchild++;
        cur = cur->next;
    }
    cur = def->content;
    while (cur != NULL) {
        nbchild++;
        cur = cur->next;
    }

    list = (xmlRelaxNGDefinePtr **) xmlMalloc(nbchild *
                                              sizeof(xmlRelaxNGDefinePtr
                                                     *));
    if (list == NULL) {
        xmlRngPErrMemory(ctxt, "building group\n");
        return;
    }
    i = 0;
    cur = def->attrs;
    while (cur != NULL) {
        list[i] = xmlRelaxNGGetElements(ctxt, cur, 1);
        i++;
        cur = cur->next;
    }
    cur = def->content;
    while (cur != NULL) {
        list[i] = xmlRelaxNGGetElements(ctxt, cur, 1);
        i++;
        cur = cur->next;
    }

    for (i = 0; i < nbchild; i++) {
        if (list[i] == NULL)
            continue;
        for (j = 0; j < i; j++) {
            if (list[j] == NULL)
                continue;
            ret = xmlRelaxNGCompareElemDefLists(ctxt, list[i], list[j]);
            if (ret == 0) {
                xmlRngPErr(ctxt, def->node, XML_RNGP_GROUP_ATTR_CONFLICT,
                           "Attributes conflicts in group\n", NULL, NULL);
            }
        }
    }
    for (i = 0; i < nbchild; i++) {
        if (list[i] != NULL)
            xmlFree(list[i]);
    }

    xmlFree(list);
    def->dflags |= IS_PROCESSED;
}